

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * vera::packSprite(Image *__return_storage_ptr__,
                        vector<vera::Image,_std::allocator<vera::Image>_> *_images)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  float local_130;
  thread *t_1;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  Image *local_e8;
  size_t local_e0;
  id local_d8;
  size_t local_d0;
  size_t local_c8;
  ulong local_c0;
  thread local_b8;
  thread t;
  size_t end_layer;
  size_t start_layer;
  size_t i;
  size_t layersLeftOver;
  size_t layersPerThread;
  undefined1 local_80 [4];
  int nThreads;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  size_t channels;
  size_t height;
  size_t width;
  size_t layers_per_side;
  size_t layerChannels;
  size_t layerHeight;
  size_t layerWidth;
  vector<vera::Image,_std::allocator<vera::Image>_> *_images_local;
  Image *out;
  
  Image::Image(__return_storage_ptr__);
  sVar5 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_images);
  if (sVar5 != 0) {
    pvVar6 = std::vector<vera::Image,_std::allocator<vera::Image>_>::operator[](_images,0);
    iVar2 = (*pvVar6->_vptr_Image[6])();
    pvVar6 = std::vector<vera::Image,_std::allocator<vera::Image>_>::operator[](_images,0);
    iVar3 = (*pvVar6->_vptr_Image[7])();
    pvVar6 = std::vector<vera::Image,_std::allocator<vera::Image>_>::operator[](_images,0);
    iVar4 = (*pvVar6->_vptr_Image[8])();
    sVar5 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_images);
    local_130 = (float)sVar5;
    dVar9 = std::sqrt((double)(ulong)(uint)local_130);
    dVar9 = std::ceil((double)((ulong)dVar9 & 0xffffffff));
    uVar7 = (ulong)SUB84(dVar9,0);
    uVar7 = uVar7 | (long)(SUB84(dVar9,0) - 9.223372e+18) & (long)uVar7 >> 0x3f;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(long)iVar4;
    Image::allocate(__return_storage_ptr__,(long)iVar2 * uVar7,(long)iVar3 * uVar7,
                    (size_t)(long)iVar4);
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_80);
    iVar4 = std::thread::hardware_concurrency();
    sVar5 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_images);
    uVar8 = sVar5 / (ulong)(long)iVar4;
    sVar5 = std::vector<vera::Image,_std::allocator<vera::Image>_>::size(_images);
    for (start_layer = 0; start_layer < (ulong)(long)iVar4; start_layer = start_layer + 1) {
      local_e0 = start_layer * uVar8;
      t._M_id._M_thread = (id)(local_e0 + uVar8);
      if (start_layer == (long)(iVar4 + -1)) {
        t._M_id._M_thread = (id)(local_e0 + uVar8 + sVar5 % (ulong)(long)iVar4);
      }
      local_d8 = t._M_id._M_thread;
      __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)_images;
      local_e8 = __return_storage_ptr__;
      local_d0 = (long)iVar2;
      local_c8 = (long)iVar3;
      local_c0 = uVar7;
      std::thread::
      thread<vera::packSprite(std::vector<vera::Image,std::allocator<vera::Image>>const&)::__0,,void>
                (&local_b8,(type *)&__range1);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_80,&local_b8);
      std::thread::~thread(&local_b8);
    }
    __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                       ((vector<std::thread,_std::allocator<std::thread>_> *)local_80);
    t_1 = (thread *)
          std::vector<std::thread,_std::allocator<std::thread>_>::end
                    ((vector<std::thread,_std::allocator<std::thread>_> *)local_80);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                       *)&t_1), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator*(&__end1);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&__end1);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Image packSprite( const std::vector<Image>& _images ) {
    Image out;

    if (_images.size() == 0)
        return out;

    // Let's asume they are all equal
    size_t layerWidth = _images[0].getWidth();
    size_t layerHeight = _images[0].getHeight();
    size_t layerChannels = _images[0].getChannels();

    size_t layers_per_side = std::ceil( std::sqrt( float(_images.size()) ));
    size_t width = layerWidth * layers_per_side;
    size_t height = layerHeight * layers_per_side;
    size_t channels = layerChannels;

    out.allocate(width, height, channels);

    std::vector<std::thread> threads;
    const int nThreads = std::thread::hardware_concurrency();
    size_t layersPerThread = _images.size() / nThreads;
    size_t layersLeftOver = _images.size() % nThreads;
    for (size_t i = 0; i < nThreads; ++i) {
        size_t start_layer = i * layersPerThread;
        size_t end_layer = start_layer + layersPerThread;
        if (i == nThreads - 1)
            end_layer = start_layer + layersPerThread + layersLeftOver;

        std::thread t(
            [&_images, &out, start_layer, end_layer, layerWidth, layerHeight, layers_per_side ]() {
                for (size_t z = start_layer; z < end_layer; z++)
                for (size_t y = 0; y < layerHeight; y++)
                for (size_t x = 0; x < layerWidth; x++) {
                    size_t layerX = (z % layers_per_side) * layerWidth; 
                    size_t layerY = floor(z / layers_per_side) * layerHeight;
                    out.setColor(   out.getIndex(layerX + x, layerY + y), 
                                    _images[z].getColor( _images[z].getIndex(x, y) ));
                }
            }
        );
        threads.push_back(std::move(t));
    }

    for (std::thread& t : threads)
        t.join();

    return out;
}